

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int vs_se(bitstream *str,int32_t *val)

{
  int iVar1;
  uint uVar2;
  uint32_t tmp;
  
  if (str->dir == VS_ENCODE) {
    iVar1 = *val;
    tmp = iVar1 * 2 - 1;
    if (iVar1 < 1) {
      tmp = iVar1 * -2;
    }
    iVar1 = vs_ue(str,&tmp);
  }
  else {
    iVar1 = vs_ue(str,&tmp);
    if (iVar1 == 0) {
      uVar2 = tmp + 1 >> 1;
      if ((tmp & 1) == 0) {
        uVar2 = -(tmp >> 1);
      }
      *val = uVar2;
      iVar1 = 0;
    }
    else {
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int vs_se(struct bitstream *str, int32_t *val) {
	uint32_t tmp;
	if (str->dir == VS_ENCODE) {
		if (*val == (int32_t)(-0x7fffffff-1)) {
			fprintf (stderr, "Exp-Golomb signed number equal to -2^31\n");
			return 1;
		}
		if (*val > 0) {
			tmp = *val * 2 - 1;
		} else {
			tmp = -*val * 2;
		}
		return vs_ue(str, &tmp);
	} else {
		if (vs_ue(str, &tmp))
			return 1;
		if (tmp & 1) {
			*val = (tmp + 1) >> 1;
		} else {
			*val = -(tmp >> 1);
		}
		return 0;
	}
}